

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalNinjaGenerator::WriteTargetRebuildManifest(cmGlobalNinjaGenerator *this,ostream *os)

{
  _Rb_tree_header *p_Var1;
  __uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> _Var2;
  pointer puVar3;
  cmMakefile *pcVar4;
  pointer pbVar5;
  cmake *pcVar6;
  long lVar7;
  _Alloc_hider _Var8;
  size_type sVar9;
  pointer pbVar10;
  bool bVar11;
  byte bVar12;
  int iVar13;
  string *psVar14;
  string *__x;
  mapped_type *pmVar15;
  ostream *poVar16;
  ulong uVar17;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  string *fi;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  pointer puVar18;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view source;
  string_view source_00;
  string_view source_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar19;
  string verifyScriptFile;
  string verifyStampFile;
  cmNinjaRule rule;
  cmNinjaBuild vgBuild;
  cmNinjaBuild reBuild;
  string local_518;
  string local_4f8;
  ostream *local_4d8;
  string local_4d0;
  undefined1 local_4b0 [32];
  _Alloc_hider local_490;
  size_type local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  _Alloc_hider local_470;
  pointer local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  _Alloc_hider local_450;
  pointer local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  _Alloc_hider local_430;
  pointer local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  _Alloc_hider local_410;
  pointer local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  _Alloc_hider local_3f0;
  pointer local_3e8;
  undefined1 local_3e0 [16];
  _Alloc_hider local_3d0;
  _Base_ptr local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  _Alloc_hider local_3b0;
  size_type local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  bool local_390;
  pointer local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_330;
  size_type local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  size_type local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  char *local_2d0;
  size_type local_2c8;
  char local_2c0;
  uint7 uStack_2bf;
  undefined8 uStack_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  char *local_290;
  size_type local_288;
  char local_280;
  undefined7 uStack_27f;
  undefined8 uStack_278;
  cmNinjaBuild local_270;
  undefined1 local_150 [32];
  _Alloc_hider local_130;
  pointer local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  pointer local_110;
  pointer local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_4d8 = os;
  local_4b0._0_8_ = local_4b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4b0,"CMAKE_SUPPRESS_REGENERATION","");
  bVar11 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)local_4b0);
  if ((undefined1 *)local_4b0._0_8_ != local_4b0 + 0x10) {
    operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
  }
  if (bVar11) {
    return;
  }
  puVar18 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_290 = &local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"RERUN_CMAKE","");
  local_4b0._0_8_ = local_4b0 + 0x10;
  if (local_290 == &local_280) {
    local_4b0._24_8_ = uStack_278;
  }
  else {
    local_4b0._0_8_ = local_290;
  }
  local_4b0._17_7_ = uStack_27f;
  local_4b0[0x10] = local_280;
  local_490._M_p = (pointer)&local_480;
  local_4b0._8_8_ = local_288;
  local_288 = 0;
  local_280 = '\0';
  local_488 = 0;
  local_480._M_allocated_capacity = local_480._M_allocated_capacity & 0xffffffffffffff00;
  local_470._M_p = (pointer)&local_460;
  local_468 = (pointer)0x0;
  local_460._M_local_buf[0] = '\0';
  local_450._M_p = (pointer)&local_440;
  local_448 = (pointer)0x0;
  local_440._M_local_buf[0] = '\0';
  local_430._M_p = (pointer)&local_420;
  local_428 = (pointer)0x0;
  local_420._M_local_buf[0] = '\0';
  local_410._M_p = (pointer)&local_400;
  local_408 = (pointer)0x0;
  local_400._M_local_buf[0] = '\0';
  local_3f0._M_p = local_3e0;
  local_3e8 = (pointer)0x0;
  local_3e0[0] = '\0';
  local_3d0._M_p = (pointer)&local_3c0;
  local_3c8 = (_Base_ptr)0x0;
  local_3c0._M_allocated_capacity = local_3c0._M_allocated_capacity & 0xffffffffffffff00;
  local_3b0._M_p = (pointer)&local_3a0;
  local_3a8 = 0;
  local_3a0._M_local_buf[0] = '\0';
  local_390 = false;
  local_290 = &local_280;
  CMakeCmd_abi_cxx11_(&local_518,this);
  sVar9 = local_518._M_string_length;
  _Var8._M_p = local_518._M_dataplus._M_p;
  _Var2._M_t.super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
  super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
       (puVar18->_M_t).
       super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t;
  psVar14 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_
                      ((cmLocalGenerator *)
                       _Var2._M_t.
                       super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                       .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
  source._M_str = (psVar14->_M_dataplus)._M_p;
  source._M_len = psVar14->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_4f8,
             (cmOutputConverter *)
             ((long)_Var2._M_t.
                    super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                    .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl + 8),source,SHELL
            );
  _Var2._M_t.super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
  super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
       (puVar18->_M_t).
       super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t;
  psVar14 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                      ((cmLocalGenerator *)
                       _Var2._M_t.
                       super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                       .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
  source_00._M_str = (psVar14->_M_dataplus)._M_p;
  source_00._M_len = psVar14->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_4d0,
             (cmOutputConverter *)
             ((long)_Var2._M_t.
                    super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                    .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl + 8),source_00,
             SHELL);
  local_150._0_8_ = sVar9;
  local_150._8_8_ = _Var8._M_p;
  local_150._16_8_ = 0x1d;
  local_150._24_8_ = " --regenerate-during-build -S";
  local_130._M_p = (pointer)local_4f8._M_string_length;
  local_128 = local_4f8._M_dataplus._M_p;
  local_120._M_allocated_capacity = 3;
  local_120._8_8_ = (long)"No build directory specified for -B" + 0x20;
  local_110 = (pointer)local_4d0._M_string_length;
  local_108 = (pointer)local_4d0._M_dataplus._M_p;
  views._M_len = 5;
  views._M_array = (iterator)local_150;
  cmCatViews_abi_cxx11_(&local_270.Comment,views);
  std::__cxx11::string::operator=((string *)&local_490,(string *)&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.Comment._M_dataplus._M_p != &local_270.Comment.field_2) {
    operator_delete(local_270.Comment._M_dataplus._M_p,
                    local_270.Comment.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace((ulong)&local_470,0,(char *)local_468,0x7044ab);
  std::__cxx11::string::_M_replace((ulong)&local_450,0,(char *)local_448,0x7044bf);
  local_390 = true;
  WriteRule((ostream *)
            (this->RulesFileStream)._M_t.
            super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
            .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
            (cmNinjaRule *)local_4b0);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_4b0);
  local_2b0 = &local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"RERUN_CMAKE","");
  local_150._0_8_ = local_150 + 0x10;
  local_150._8_8_ = (char *)0x0;
  local_150._16_8_ = local_150._16_8_ & 0xffffffffffffff00;
  local_130._M_p = (pointer)&local_120;
  if (local_2b0 == &local_2a0) {
    local_120._8_8_ = local_2a0._8_8_;
  }
  else {
    local_130._M_p = (pointer)local_2b0;
  }
  local_128 = (pointer)local_2a8;
  local_2a8 = 0;
  local_2a0._M_local_buf[0] = '\0';
  p_Var1 = &local_80._M_impl.super__Rb_tree_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_338 = puVar18;
  local_2b0 = &local_2a0;
  memset(&local_110,0,0x90);
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_80._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::__cxx11::string::_M_replace((ulong)local_150,0,(char *)0x0,0x7044da);
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x47])
            (this,&local_110);
  puVar18 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar18 != puVar3) {
    do {
      pcVar4 = ((puVar18->_M_t).
                super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t
                .super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
      pbVar5 = (pcVar4->ListFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar14 = *(string **)
                      &(pcVar4->ListFiles).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl; psVar14 != pbVar5; psVar14 = psVar14 + 1) {
        __x = ConvertToNinjaPath(this,psVar14);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_b0,__x);
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 != puVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_b0,&this->CMakeCacheFile);
  iVar13 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
             [0x40])(this);
  if ((char)iVar13 != '\0') {
    local_4b0._0_8_ = local_4b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"pool","");
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_80,(key_type *)local_4b0);
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x703b1f);
    if ((undefined1 *)local_4b0._0_8_ != local_4b0 + 0x10) {
      operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
    }
  }
  pcVar6 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  bVar12 = this->NinjaSupportsManifestRestat;
  if ((bool)bVar12 == true) {
    bVar11 = cmake::DoWriteGlobVerifyTarget(pcVar6);
    if (bVar11) {
      local_2d0 = &local_2c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"VERIFY_GLOBS","");
      local_4b0._0_8_ = local_4b0 + 0x10;
      if (local_2d0 == &local_2c0) {
        local_4b0._24_8_ = uStack_2b8;
      }
      else {
        local_4b0._0_8_ = local_2d0;
      }
      local_4b0._16_8_ = (ulong)uStack_2bf << 8;
      local_4b0._8_8_ = local_2c8;
      local_2c8 = 0;
      local_2c0 = '\0';
      local_488 = 0;
      local_480._M_allocated_capacity = local_480._M_allocated_capacity & 0xffffffffffffff00;
      local_470._M_p = (pointer)&local_460;
      local_468 = (pointer)0x0;
      local_460._M_local_buf[0] = '\0';
      local_450._M_p = (pointer)&local_440;
      local_448 = (pointer)0x0;
      local_440._M_local_buf[0] = '\0';
      local_430._M_p = (pointer)&local_420;
      local_428 = (pointer)0x0;
      local_420._M_local_buf[0] = '\0';
      local_410._M_p = (pointer)&local_400;
      local_408 = (pointer)0x0;
      local_400._M_local_buf[0] = '\0';
      local_3f0._M_p = local_3e0;
      local_3e8 = (pointer)0x0;
      local_3e0[0] = '\0';
      local_3d0._M_p = (pointer)&local_3c0;
      local_3c8 = (_Base_ptr)0x0;
      local_3c0._M_allocated_capacity = local_3c0._M_allocated_capacity & 0xffffffffffffff00;
      local_3b0._M_p = (pointer)&local_3a0;
      local_3a8 = 0;
      local_3a0._M_local_buf[0] = '\0';
      local_390 = false;
      local_490._M_p = (pointer)&local_480;
      local_2d0 = &local_2c0;
      CMakeCmd_abi_cxx11_(&local_4f8,this);
      _Var8._M_p = local_4f8._M_dataplus._M_p;
      _Var2._M_t.super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
      super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
           (local_338->_M_t).
           super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t;
      psVar14 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar6);
      source_01._M_str = (psVar14->_M_dataplus)._M_p;
      source_01._M_len = psVar14->_M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_4d0,
                 (cmOutputConverter *)
                 ((long)_Var2._M_t.
                        super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                        .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl + 8),
                 source_01,SHELL);
      local_270.Comment._M_dataplus._M_p = (pointer)local_4f8._M_string_length;
      local_270.Comment._M_string_length = (size_type)_Var8._M_p;
      local_270.Comment.field_2._M_allocated_capacity = 4;
      local_270.Comment.field_2._8_8_ = (long)"$(CMAKE_COMMAND) -P " + 0x10;
      local_270.Rule._M_dataplus._M_p = (pointer)local_4d0._M_string_length;
      local_270.Rule._M_string_length = (size_type)local_4d0._M_dataplus._M_p;
      views_00._M_len = 3;
      views_00._M_array = (iterator)&local_270;
      cmCatViews_abi_cxx11_(&local_518,views_00);
      std::__cxx11::string::operator=((string *)&local_490,(string *)&local_518);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
        operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace((ulong)&local_470,0,(char *)local_468,0x704512);
      std::__cxx11::string::_M_replace((ulong)&local_450,0,(char *)local_448,0x704535);
      local_390 = true;
      WriteRule((ostream *)
                (this->RulesFileStream)._M_t.
                super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                (cmNinjaRule *)local_4b0);
      cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_4b0);
      local_2f0 = &local_2e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"phony","");
      local_4b0._0_8_ = local_4b0 + 0x10;
      local_4b0._8_8_ = 0;
      local_4b0._16_8_ = local_4b0._16_8_ & 0xffffffffffffff00;
      if (local_2f0 == &local_2e0) {
        local_480._8_8_ = local_2e0._8_8_;
        local_490._M_p = (pointer)&local_480;
      }
      else {
        local_490._M_p = (pointer)local_2f0;
      }
      local_480._M_allocated_capacity._1_7_ = local_2e0._M_allocated_capacity._1_7_;
      local_480._M_local_buf[0] = local_2e0._M_local_buf[0];
      local_488 = local_2e8;
      local_2e8 = 0;
      local_2e0._M_local_buf[0] = '\0';
      local_3e0._8_4_ = 0;
      local_3d0._M_p = (pointer)0x0;
      local_2f0 = &local_2e0;
      memset((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_470,0,0x90)
      ;
      local_3c0._8_8_ = 0;
      local_3b0._M_p = (pointer)&local_3a0;
      local_3a8 = 0;
      local_3a0._M_local_buf[0] = '\0';
      local_3c8 = (_Base_ptr)(local_3e0 + 8);
      local_3c0._M_allocated_capacity = (size_type)(_Base_ptr)(local_3e0 + 8);
      std::__cxx11::string::_M_replace((ulong)local_4b0,0,(char *)0x0,0x70455f);
      psVar14 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar6);
      local_270.Comment._M_string_length = (size_type)(psVar14->_M_dataplus)._M_p;
      local_270.Comment._M_dataplus._M_p = (pointer)psVar14->_M_string_length;
      local_270.Comment.field_2._M_allocated_capacity = 6;
      local_270.Comment.field_2._8_8_ = (long)"cmake_force" + 5;
      views_01._M_len = 2;
      views_01._M_array = (iterator)&local_270;
      cmCatViews_abi_cxx11_(&local_518,views_01);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_470,
                 &local_518);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
      }
      WriteBuild(this,local_4d8,(cmNinjaBuild *)local_4b0,0,(bool *)0x0);
      local_270.Comment._M_dataplus._M_p = (pointer)&local_270.Comment.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"restat","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_80,&local_270.Comment);
      std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x7563b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270.Comment._M_dataplus._M_p != &local_270.Comment.field_2) {
        operator_delete(local_270.Comment._M_dataplus._M_p,
                        local_270.Comment.field_2._M_allocated_capacity + 1);
      }
      psVar14 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar6);
      NinjaOutputPath(&local_518,this,psVar14);
      psVar14 = cmake::GetGlobVerifyStamp_abi_cxx11_(pcVar6);
      NinjaOutputPath(&local_4f8,this,psVar14);
      local_310 = &local_300;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"VERIFY_GLOBS","");
      local_270.Rule._M_dataplus._M_p = (pointer)&local_270.Rule.field_2;
      local_270.Comment._M_dataplus._M_p = (pointer)&local_270.Comment.field_2;
      local_270.Comment._M_string_length = 0;
      local_270.Comment.field_2._M_allocated_capacity =
           local_270.Comment.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if (local_310 == &local_300) {
        local_270.Rule.field_2._8_8_ = local_300._8_8_;
      }
      else {
        local_270.Rule._M_dataplus._M_p = (pointer)local_310;
      }
      local_270.Rule._M_string_length = local_308;
      local_308 = 0;
      local_300._M_local_buf[0] = '\0';
      p_Var1 = &local_270.Variables._M_t._M_impl.super__Rb_tree_header;
      local_270.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_270.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_310 = &local_300;
      memset(&local_270.Outputs,0,0x90);
      local_270.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_270.RspFile._M_dataplus._M_p = (pointer)&local_270.RspFile.field_2;
      local_270.RspFile._M_string_length = 0;
      local_270.RspFile.field_2._M_local_buf[0] = '\0';
      local_270.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_270.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
      ;
      std::__cxx11::string::_M_replace((ulong)&local_270,0,(char *)0x0,0x70458c);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_270.Outputs,&local_4f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_270.ImplicitDeps,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_470);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(&local_270.Variables._M_t,&local_80);
      WriteBuild(this,local_4d8,&local_270,0,(bool *)0x0);
      cmNinjaBuild::~cmNinjaBuild(&local_270);
      local_270.Comment._M_dataplus._M_p = (pointer)&local_270.Comment.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"restat","");
      pVar19 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::equal_range(&local_80,&local_270.Comment);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&local_80,(_Base_ptr)pVar19.first._M_node,(_Base_ptr)pVar19.second._M_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270.Comment._M_dataplus._M_p != &local_270.Comment.field_2) {
        operator_delete(local_270.Comment._M_dataplus._M_p,
                        local_270.Comment.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_b0,&local_518);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_c8,&local_4f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
        operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
      }
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_4b0);
      goto LAB_0036b92a;
    }
    bVar12 = this->NinjaSupportsManifestRestat;
  }
  if (((bVar12 & 1) == 0) && (bVar11 = cmake::DoWriteGlobVerifyTarget(pcVar6), bVar11)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4b0,"The detected version of Ninja:\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,"  ",2);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4b0,(this->NinjaVersion)._M_dataplus._M_p,
                         (this->NinjaVersion)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,
               "is less than the version of Ninja required by CMake for adding restat dependencies to the build.ninja manifest regeneration target:\n"
               ,0x84);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"  ",2);
    local_270.Comment._M_dataplus._M_p = (pointer)&local_270.Comment.field_2;
    local_270.Comment.field_2._M_allocated_capacity._0_4_ = 0x382e31;
    local_270.Comment._M_string_length = 3;
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,local_270.Comment._M_dataplus._M_p,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.Comment._M_dataplus._M_p != &local_270.Comment.field_2) {
      operator_delete(local_270.Comment._M_dataplus._M_p,
                      local_270.Comment.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4b0,
               "Any pre-check scripts, such as those generated for file(GLOB CONFIGURE_DEPENDS), will not be run by Ninja."
               ,0x6a);
    pcVar6 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
    std::__cxx11::stringbuf::str();
    local_518._M_dataplus._M_p = (pointer)0x0;
    local_518._M_string_length = 0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_518);
    cmake::IssueMessage(pcVar6,AUTHOR_WARNING,&local_270.Comment,(cmListFileBacktrace *)&local_518);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_518._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.Comment._M_dataplus._M_p != &local_270.Comment.field_2) {
      operator_delete(local_270.Comment._M_dataplus._M_p,
                      local_270.Comment.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
    std::ios_base::~ios_base((ios_base *)local_440._M_local_buf);
  }
LAB_0036b92a:
  pbVar10 = local_b0[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = local_b0[0].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_b0[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b0[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar17 = (long)local_b0[0].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b0[0].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar7 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_b0[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_b0[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar5,pbVar10);
  }
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (local_b0[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_b0[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(local_b0,(iterator)__first._M_current,
             (iterator)
             local_b0[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  WriteBuild(this,local_4d8,(cmNinjaBuild *)local_150,0,(bool *)0x0);
  local_330 = &local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"phony","");
  local_4b0._0_8_ = local_4b0 + 0x10;
  local_4b0._8_8_ = 0;
  local_4b0._16_8_ = local_4b0._16_8_ & 0xffffffffffffff00;
  if (local_330 == &local_320) {
    local_480._8_8_ = local_320._8_8_;
    local_490._M_p = (pointer)&local_480;
  }
  else {
    local_490._M_p = (pointer)local_330;
  }
  local_488 = local_328;
  local_328 = 0;
  local_320._M_local_buf[0] = '\0';
  local_3e0._8_4_ = 0;
  local_3d0._M_p = (pointer)0x0;
  local_330 = &local_320;
  memset(&local_470,0,0x90);
  local_3c0._8_8_ = 0;
  local_3b0._M_p = (pointer)&local_3a0;
  local_3a8 = 0;
  local_3a0._M_local_buf[0] = '\0';
  local_3c8 = (_Base_ptr)(local_3e0 + 8);
  local_3c0._M_allocated_capacity = (size_type)(_Base_ptr)(local_3e0 + 8);
  std::__cxx11::string::_M_replace((ulong)local_4b0,0,(char *)0x0,0x7046d2);
  std::
  __set_difference<std::move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_b0[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_b0[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  WriteBuild(this,local_4d8,(cmNinjaBuild *)local_4b0,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_4b0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_150);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetRebuildManifest(std::ostream& os)
{
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return;
  }
  const auto& lg = this->LocalGenerators[0];

  {
    cmNinjaRule rule("RERUN_CMAKE");
    rule.Command =
      cmStrCat(this->CMakeCmd(), " --regenerate-during-build -S",
               lg->ConvertToOutputFormat(lg->GetSourceDirectory(),
                                         cmOutputConverter::SHELL),
               " -B",
               lg->ConvertToOutputFormat(lg->GetBinaryDirectory(),
                                         cmOutputConverter::SHELL));
    rule.Description = "Re-running CMake...";
    rule.Comment = "Rule for re-running cmake.";
    rule.Generator = true;
    WriteRule(*this->RulesFileStream, rule);
  }

  cmNinjaBuild reBuild("RERUN_CMAKE");
  reBuild.Comment = "Re-run CMake if any of its inputs changed.";
  this->AddRebuildManifestOutputs(reBuild.Outputs);

  for (const auto& localGen : this->LocalGenerators) {
    for (std::string const& fi : localGen->GetMakefile()->GetListFiles()) {
      reBuild.ImplicitDeps.push_back(this->ConvertToNinjaPath(fi));
    }
  }
  reBuild.ImplicitDeps.push_back(this->CMakeCacheFile);

  // Use 'console' pool to get non buffered output of the CMake re-run call
  // Available since Ninja 1.5
  if (this->SupportsDirectConsole()) {
    reBuild.Variables["pool"] = "console";
  }

  cmake* cm = this->GetCMakeInstance();
  if (this->SupportsManifestRestat() && cm->DoWriteGlobVerifyTarget()) {
    {
      cmNinjaRule rule("VERIFY_GLOBS");
      rule.Command =
        cmStrCat(this->CMakeCmd(), " -P ",
                 lg->ConvertToOutputFormat(cm->GetGlobVerifyScript(),
                                           cmOutputConverter::SHELL));
      rule.Description = "Re-checking globbed directories...";
      rule.Comment = "Rule for re-checking globbed directories.";
      rule.Generator = true;
      this->WriteRule(*this->RulesFileStream, rule);
    }

    cmNinjaBuild phonyBuild("phony");
    phonyBuild.Comment = "Phony target to force glob verification run.";
    phonyBuild.Outputs.push_back(
      cmStrCat(cm->GetGlobVerifyScript(), "_force"));
    this->WriteBuild(os, phonyBuild);

    reBuild.Variables["restat"] = "1";
    std::string const verifyScriptFile =
      this->NinjaOutputPath(cm->GetGlobVerifyScript());
    std::string const verifyStampFile =
      this->NinjaOutputPath(cm->GetGlobVerifyStamp());
    {
      cmNinjaBuild vgBuild("VERIFY_GLOBS");
      vgBuild.Comment =
        "Re-run CMake to check if globbed directories changed.";
      vgBuild.Outputs.push_back(verifyStampFile);
      vgBuild.ImplicitDeps = phonyBuild.Outputs;
      vgBuild.Variables = reBuild.Variables;
      this->WriteBuild(os, vgBuild);
    }
    reBuild.Variables.erase("restat");
    reBuild.ImplicitDeps.push_back(verifyScriptFile);
    reBuild.ExplicitDeps.push_back(verifyStampFile);
  } else if (!this->SupportsManifestRestat() &&
             cm->DoWriteGlobVerifyTarget()) {
    std::ostringstream msg;
    msg << "The detected version of Ninja:\n"
        << "  " << this->NinjaVersion << "\n"
        << "is less than the version of Ninja required by CMake for adding "
           "restat dependencies to the build.ninja manifest regeneration "
           "target:\n"
        << "  "
        << cmGlobalNinjaGenerator::RequiredNinjaVersionForManifestRestat()
        << "\n";
    msg << "Any pre-check scripts, such as those generated for file(GLOB "
           "CONFIGURE_DEPENDS), will not be run by Ninja.";
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           msg.str());
  }

  std::sort(reBuild.ImplicitDeps.begin(), reBuild.ImplicitDeps.end());
  reBuild.ImplicitDeps.erase(
    std::unique(reBuild.ImplicitDeps.begin(), reBuild.ImplicitDeps.end()),
    reBuild.ImplicitDeps.end());

  this->WriteBuild(os, reBuild);

  {
    cmNinjaBuild build("phony");
    build.Comment = "A missing CMake input file is not an error.";
    std::set_difference(std::make_move_iterator(reBuild.ImplicitDeps.begin()),
                        std::make_move_iterator(reBuild.ImplicitDeps.end()),
                        this->CustomCommandOutputs.begin(),
                        this->CustomCommandOutputs.end(),
                        std::back_inserter(build.Outputs));
    this->WriteBuild(os, build);
  }
}